

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O2

unsigned_short sxhash(LispPTR obj)

{
  ushort *puVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  LispPTR *pLVar7;
  DLword *pDVar8;
  byte bVar9;
  ulong uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ushort uVar16;
  bool bVar17;
  
  uVar10 = (ulong)obj;
  uVar16 = 0;
LAB_0012b2b7:
  uVar14 = (uint)uVar10;
  if ((uVar14 & 0xfff0000 | 0x10000) != 0xf0000) {
    uVar13 = (uint)(uVar10 >> 9);
    switch(*(ushort *)((ulong)(uVar13 * 2) + (long)MDStypetbl ^ 2) & 0x7ff) {
    case 2:
      pLVar7 = NativeAligned4FromLAddr(uVar14);
      uVar14 = (uint)(ushort)*pLVar7;
      break;
    case 3:
      pLVar7 = NativeAligned4FromLAddr(uVar14);
      uVar14 = *pLVar7 >> 0x10 ^ *pLVar7;
      break;
    case 5:
      iVar15 = 0xd;
      uVar14 = 0;
      while ((bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17 &&
             ((*(ushort *)((ulong)((uint)(uVar10 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff)
              == 5))) {
        LVar6 = car((LispPTR)uVar10);
        uVar2 = sxhash(LVar6);
        uVar12 = (ushort)uVar14 ^ uVar2;
        uVar14 = (uint)(ushort)(uVar12 << 7 | uVar12 >> 9);
        LVar6 = cdr((LispPTR)uVar10);
        uVar10 = (ulong)LVar6;
      }
      break;
    case 0xe:
    case 0x10:
      pLVar7 = NativeAligned4FromLAddr(uVar14);
      uVar12 = *(ushort *)((long)pLVar7 + 6);
      if ((uVar12 >> 0xc & 1) != 0) {
        uVar13 = 0xd;
        if (pLVar7[2] < 0xd) {
          uVar13 = pLVar7[2];
        }
        if ((char)uVar12 == 'D') {
          pDVar8 = Lisp_world + (ulong)(ushort)pLVar7[1] + (ulong)(*pLVar7 & 0xfffffff);
          uVar14 = 0;
          while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
            uVar12 = (ushort)uVar14 ^ *(ushort *)((ulong)pDVar8 ^ 2);
            uVar14 = (uint)(ushort)(uVar12 << 7 | uVar12 >> 9);
            pDVar8 = pDVar8 + 1;
          }
        }
        else if ((char)uVar12 == 'C') {
          uVar10 = (long)Lisp_world + (ulong)(ushort)pLVar7[1] + (ulong)(*pLVar7 & 0xfffffff) * 2;
          uVar14 = 0;
          while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
            uVar14 = (uint)(ushort)(((ushort)uVar14 ^ (ushort)*(byte *)(uVar10 ^ 3)) << 7 |
                                   (ushort)uVar14 >> 9);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          error("SXHASH of a string not made of chars!\n");
          uVar14 = 0;
        }
        break;
      }
      if ((uVar12 >> 0xd & 1) != 0) {
        LVar6 = pLVar7[2];
        uVar12 = (ushort)pLVar7[1];
        puVar1 = Lisp_world + (ulong)(*pLVar7 & 0xfffffff) + (ulong)(uVar12 >> 4);
        if (uVar12 == 0) {
          uVar11 = *puVar1;
        }
        else {
          bVar9 = (byte)uVar12 & 0xf;
          uVar11 = *(short *)((ulong)puVar1 ^ 2) << bVar9 |
                   *(ushort *)((ulong)(puVar1 + 1) ^ 2) >> 0x10 - bVar9;
          LVar6 = LVar6 - uVar12;
        }
        uVar14 = (uint)uVar11;
        if (LVar6 < 0x10) {
          uVar14 = (uint)(uVar11 >> (0x10U - (char)LVar6 & 0x1f));
        }
        break;
      }
    default:
      uVar14 = uVar14 << 3 ^ (uint)(uVar10 >> 0x10);
      uVar13 = uVar13 & 0x7f;
LAB_0012b4bd:
      uVar14 = uVar13 ^ uVar14;
      break;
    case 0x11:
      pLVar7 = NativeAligned4FromLAddr(uVar14);
      LVar6 = *pLVar7;
      LVar5 = car(LVar6);
      LVar6 = cdr(LVar6);
      LVar6 = car(LVar6);
      uVar14 = LVar6 * 0x1000 + LVar5;
      break;
    case 0x12:
      pLVar7 = NativeAligned4FromLAddr(uVar14);
      uVar2 = sxhash(*pLVar7);
      uVar14 = (uint)uVar2;
      uVar2 = sxhash(pLVar7[1]);
      uVar13 = (uint)uVar2;
      goto LAB_0012b4bd;
    case 0x13:
      goto switchD_0012b2f0_caseD_13;
    case 0x14:
      pLVar7 = NativeAligned4FromLAddr(uVar14);
      uVar2 = sxhash(*pLVar7);
      uVar3 = sxhash(pLVar7[1]);
      uVar4 = sxhash(pLVar7[4]);
      uVar12 = uVar4 ^ ((uVar3 ^ uVar2) << 7 | (uVar3 ^ uVar2) >> 9);
      uVar2 = sxhash(pLVar7[5]);
      uVar12 = uVar2 ^ (uVar12 << 7 | uVar12 >> 9);
      uVar2 = sxhash(pLVar7[2]);
      uVar12 = uVar2 ^ (uVar12 << 7 | uVar12 >> 9);
      uVar2 = sxhash(pLVar7[3]);
      uVar12 = uVar2 ^ (uVar12 << 7 | uVar12 >> 9);
      uVar14 = (uint)(ushort)(uVar12 << 7 | uVar12 >> 9);
    }
  }
  return (ushort)uVar14 ^ uVar16;
switchD_0012b2f0_caseD_13:
  pLVar7 = NativeAligned4FromLAddr(uVar14);
  uVar2 = sxhash(*pLVar7);
  uVar10 = (ulong)pLVar7[1];
  uVar16 = uVar16 ^ uVar2;
  goto LAB_0012b2b7;
}

Assistant:

static unsigned short sxhash(LispPTR obj) {
  /* unsigned short hashOffset; Not Used */
  unsigned int cell;
  OneDArray *str;
  switch (SEGMASK & obj) {
    case S_POSITIVE:
    case S_NEGATIVE: return (obj & 0xFFFF);
    default:
      switch (GetTypeNumber(obj)) {
        case TYPE_FIXP: return ((FIXP_VALUE(obj)) & 0xFFFF);
        case TYPE_FLOATP:
          cell = (unsigned int)FIXP_VALUE(obj);
          return ((cell & 0xFFFF) ^ (cell >> 16));
#ifdef BIGATOMS
        case TYPE_NEWATOM: /* as for LITATOM... */
#endif                     /* BIGATOMS */

        case TYPE_LITATOM: return (EQHASHINGBITS(obj));
        case TYPE_LISTP: return (sxhash_list(obj));
        case TYPE_PATHNAME: return (sxhash_pathname(obj));
        case TYPE_ONED_ARRAY:
        case TYPE_GENERAL_ARRAY:
          str = (OneDArray *)NativeAligned4FromLAddr(obj);
          if (str->stringp) return (sxhash_string(str));
          if (str->bitp) return (sxhash_bitvec(str));
          return (EQHASHINGBITS(obj));
        case TYPE_BIGNUM: {
          LispPTR contents;
          contents = ((BIGNUM *)NativeAligned4FromLAddr(obj))->contents;
          return ((unsigned short)car(contents) + (((unsigned short)car(cdr(contents))) << 12));
        }

        case TYPE_COMPLEX: {
          COMPLEX *object;
          object = (COMPLEX *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->real) ^ sxhash(object->imaginary));
        }
        case TYPE_RATIO: {
          RATIO *object;
          object = (RATIO *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->numerator) ^ sxhash(object->denominator));
        }

        default: return (EQHASHINGBITS(obj));
      }
  }
}